

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O2

void __thiscall zstr::istreambuf::~istreambuf(istreambuf *this)

{
  *(undefined ***)this = &PTR__istreambuf_00332468;
  std::
  unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>::
  ~unique_ptr(&this->zstrm_p);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&this->out_buff);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&this->in_buff);
  std::streambuf::~streambuf(this);
  return;
}

Assistant:

istreambuf(std::streambuf* _sbuf_p,
             std::size_t _buff_size = default_buff_size,
             bool _auto_detect = true, int _window_bits = 0)
      : sbuf_p(_sbuf_p),
        in_buff(),
        in_buff_start(nullptr),
        in_buff_end(nullptr),
        out_buff(),
        zstrm_p(nullptr),
        buff_size(_buff_size),
        auto_detect(_auto_detect),
        auto_detect_run(false),
        is_text(false),
        window_bits(_window_bits) {
    assert(sbuf_p);
    in_buff = std::unique_ptr<char[]>(new char[buff_size]);
    in_buff_start = in_buff.get();
    in_buff_end = in_buff.get();
    out_buff = std::unique_ptr<char[]>(new char[buff_size]);
    setg(out_buff.get(), out_buff.get(), out_buff.get());
  }